

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_compare_coc(opj_j2k_t *p_j2k,OPJ_UINT32 p_first_comp_no,OPJ_UINT32 p_second_comp_no
                            )

{
  opj_tcp_t *poVar1;
  opj_tcp_t *l_tcp;
  opj_cp_t *l_cp;
  OPJ_UINT32 p_second_comp_no_local;
  OPJ_UINT32 p_first_comp_no_local;
  opj_j2k_t *p_j2k_local;
  
  if (p_j2k != (opj_j2k_t *)0x0) {
    poVar1 = (p_j2k->m_cp).tcps;
    if (poVar1[p_j2k->m_current_tile_number].tccps[p_first_comp_no].csty ==
        poVar1[p_j2k->m_current_tile_number].tccps[p_second_comp_no].csty) {
      p_j2k_local._4_4_ =
           opj_j2k_compare_SPCod_SPCoc
                     (p_j2k,p_j2k->m_current_tile_number,p_first_comp_no,p_second_comp_no);
    }
    else {
      p_j2k_local._4_4_ = 0;
    }
    return p_j2k_local._4_4_;
  }
  __assert_fail("p_j2k != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jpambrun[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0xa5a,"OPJ_BOOL opj_j2k_compare_coc(opj_j2k_t *, OPJ_UINT32, OPJ_UINT32)");
}

Assistant:

static OPJ_BOOL opj_j2k_compare_coc(opj_j2k_t *p_j2k, OPJ_UINT32 p_first_comp_no, OPJ_UINT32 p_second_comp_no)
{
	opj_cp_t *l_cp = NULL;
	opj_tcp_t *l_tcp = NULL;
	
	/* preconditions */
	assert(p_j2k != 00);
	
	l_cp = &(p_j2k->m_cp);
	l_tcp = &l_cp->tcps[p_j2k->m_current_tile_number];
	
	if (l_tcp->tccps[p_first_comp_no].csty != l_tcp->tccps[p_second_comp_no].csty) {
		return OPJ_FALSE;
	}
	
	
	return opj_j2k_compare_SPCod_SPCoc(p_j2k, p_j2k->m_current_tile_number, p_first_comp_no, p_second_comp_no);
}